

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

CircularListElement<HACD::TMMTriangle> * __thiscall
HACD::ICHUll::MakeConeFace
          (ICHUll *this,CircularListElement<HACD::TMMEdge> *e,
          CircularListElement<HACD::TMMVertex> *p)

{
  CircularListElement<HACD::TMMVertex> *pCVar1;
  CircularListElement<HACD::TMMTriangle> *f;
  long lVar2;
  ICHUll *this_00;
  long lVar3;
  bool bVar4;
  CircularListElement<HACD::TMMEdge> *newEdges [2];
  long alStack_50 [3];
  CircularListElement<HACD::TMMEdge> *local_38 [2];
  
  lVar3 = 3;
  do {
    pCVar1 = ((e->m_data).m_triangles[lVar3 + -1]->m_data).m_vertices[1];
    alStack_50[lVar3] = (long)pCVar1;
    if (pCVar1 == (CircularListElement<HACD::TMMVertex> *)0x0) {
      alStack_50[2] = 0x86a290;
      pCVar1 = (CircularListElement<HACD::TMMVertex> *)
               CircularList<HACD::TMMEdge>::Add(&(this->m_mesh).m_edges,(TMMEdge *)0x0);
      alStack_50[lVar3] = (long)pCVar1;
      (pCVar1->m_data).m_name = (long)(e->m_data).m_triangles[lVar3 + -1];
      (pCVar1->m_data).m_id = (size_t)p;
      ((e->m_data).m_triangles[lVar3 + -1]->m_data).m_vertices[1] = pCVar1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 4);
  this_00 = (ICHUll *)&(this->m_mesh).m_triangles;
  alStack_50[2] = 0x86a2c3;
  f = CircularList<HACD::TMMTriangle>::Add
                ((CircularList<HACD::TMMTriangle> *)this_00,(TMMTriangle *)0x0);
  (f->m_data).m_edges[0] = e;
  (f->m_data).m_edges[1] = local_38[0];
  (f->m_data).m_edges[2] = local_38[1];
  alStack_50[2] = 0x86a2e9;
  MakeCCW(this_00,f,e,p);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      if ((local_38[lVar3]->m_data).m_triangles[lVar2] ==
          (CircularListElement<HACD::TMMTriangle> *)0x0) {
        (local_38[lVar3]->m_data).m_triangles[lVar2] = f;
        break;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + 1;
    if (bVar4) {
      return f;
    }
  } while( true );
}

Assistant:

CircularListElement<TMMTriangle> * ICHUll::MakeConeFace(CircularListElement<TMMEdge> * e, CircularListElement<TMMVertex> * p)
	{
        // create two new edges if they don't already exist
        CircularListElement<TMMEdge> * newEdges[2];
        for(int i = 0; i < 2; ++i)
        {
            if ( !( newEdges[i] = e->GetData().m_vertices[i]->GetData().m_duplicate ) )  
            { // if the edge doesn't exits add it and mark the vertex as duplicated
                newEdges[i] = m_mesh.AddEdge();
                newEdges[i]->GetData().m_vertices[0] = e->GetData().m_vertices[i];
                newEdges[i]->GetData().m_vertices[1] = p;
                e->GetData().m_vertices[i]->GetData().m_duplicate = newEdges[i];
            }
        }
        // make the new face
        CircularListElement<TMMTriangle> * newFace = m_mesh.AddTriangle();
        newFace->GetData().m_edges[0] = e;
        newFace->GetData().m_edges[1] = newEdges[0];
        newFace->GetData().m_edges[2] = newEdges[1];
        MakeCCW(newFace, e, p);
        for(int i=0; i < 2; ++i)
        {
            for(int j=0; j < 2; ++j)
            {
                if ( ! newEdges[i]->GetData().m_triangles[j] )
                {
                    newEdges[i]->GetData().m_triangles[j] = newFace;
                    break;
                }
            }
        }
		return newFace;
	}